

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

int doinvbill(int mode)

{
  nh_menuitem *pnVar1;
  int iVar2;
  monst *pmVar3;
  obj *poVar4;
  char *pcVar5;
  long lVar6;
  int *piVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  uint *puVar12;
  int *piVar13;
  bool bVar14;
  menulist menu;
  menulist local_58;
  long local_48;
  monst *local_40;
  int *local_38;
  
  pmVar3 = shop_keeper(level,u.ushops[0]);
  if ((pmVar3 == (monst *)0x0) || (iVar2 = inhishop(pmVar3), iVar2 == 0)) {
    if (mode == 0) {
      return 0;
    }
    warning("doinvbill: no shopkeeper?");
    return 0;
  }
  if (mode == 0) {
    bVar14 = *(int *)&pmVar3[0x1b].field_0x60 != 0;
    uVar9 = (uint)bVar14;
    lVar6 = (long)*(short *)((long)&pmVar3[0x1b].misc_worn_check + 2);
    if (0 < lVar6) {
      puVar12 = *(uint **)&pmVar3[0x1b].mnum;
      puVar8 = puVar12 + lVar6 * 4;
      do {
        if (((char)puVar12[1] != '\0') ||
           ((poVar4 = bp_to_obj((bill_x *)(ulong)*puVar12), poVar4 != (obj *)0x0 &&
            (poVar4->quan < (int)puVar12[3])))) {
          uVar9 = uVar9 + 1;
        }
        puVar12 = puVar12 + 4;
      } while (puVar12 < puVar8);
      return uVar9;
    }
    return (uint)bVar14;
  }
  init_menulist(&local_58);
  if (local_58.size <= local_58.icount) {
    lVar6 = (long)local_58.size;
    local_58.size = local_58.size * 2;
    local_58.items = (nh_menuitem *)realloc(local_58.items,lVar6 * 0x218);
  }
  local_58.items[local_58.icount].id = 0;
  local_58.items[local_58.icount].role = MI_TEXT;
  local_58.items[local_58.icount].accel = '\0';
  local_58.items[local_58.icount].group_accel = '\0';
  local_58.items[local_58.icount].selected = '\0';
  builtin_strncpy(local_58.items[local_58.icount].caption,"Unpaid articles ",0x10);
  builtin_strncpy(local_58.items[local_58.icount].caption + 0x10,"already used up:",0x10);
  local_58.items[local_58.icount].caption[0x20] = '\0';
  local_58.icount = local_58.icount + 1;
  if (local_58.size <= local_58.icount) {
    local_58.size = local_58.size * 2;
    local_58.items = (nh_menuitem *)realloc(local_58.items,(long)local_58.size * 0x10c);
  }
  lVar6 = (long)local_58.icount;
  local_58.items[lVar6].accel = '\0';
  local_58.items[lVar6].group_accel = '\0';
  local_58.items[lVar6].selected = '\0';
  local_58.items[lVar6].caption[0] = '\0';
  local_58.items[lVar6].id = 0;
  local_58.items[lVar6].role = MI_TEXT;
  local_58.icount = local_58.icount + 1;
  lVar6 = (long)*(short *)((long)&pmVar3[0x1b].misc_worn_check + 2);
  if (lVar6 < 1) {
    iVar2 = *(int *)&pmVar3[0x1b].field_0x60;
    lVar6 = 0;
    if (iVar2 == 0) goto LAB_002405da;
  }
  else {
    piVar13 = (int *)(lVar6 * 0x10 + *(long *)&pmVar3[0x1b].mnum);
    lVar6 = 0;
    piVar7 = (int *)(*(long *)&pmVar3[0x1b].mnum + 8);
    local_40 = pmVar3;
    local_38 = piVar13;
    do {
      poVar4 = bp_to_obj((bill_x *)(ulong)(uint)piVar7[-2]);
      if (poVar4 == (obj *)0x0) {
        warning("Bad shopkeeper administration.");
        goto LAB_002406d1;
      }
      lVar10 = (long)piVar7[1];
      if ((char)piVar7[-1] == '\0') {
        if (poVar4->quan < piVar7[1]) {
          lVar10 = lVar10 - poVar4->quan;
          goto LAB_00240369;
        }
      }
      else {
LAB_00240369:
        uVar9 = *(uint *)&poVar4->field_0x4a;
        iVar2 = *piVar7;
        *(uint *)&poVar4->field_0x4a = uVar9 & 0xfffffffb;
        local_48 = lVar6;
        pcVar5 = xprname(poVar4,(char *)0x0,'x','\0',iVar2 * lVar10,lVar10);
        *(uint *)&poVar4->field_0x4a = *(uint *)&poVar4->field_0x4a & 0xfffffffb | uVar9 & 4;
        lVar6 = (long)local_58.size;
        if (local_58.size <= local_58.icount) {
          local_58.size = local_58.size * 2;
          local_58.items = (nh_menuitem *)realloc(local_58.items,lVar6 * 0x218);
        }
        lVar6 = local_48 + iVar2 * lVar10;
        pnVar1 = local_58.items + local_58.icount;
        pnVar1->id = 0;
        pnVar1->role = MI_TEXT;
        pnVar1->accel = '\0';
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,pcVar5);
        local_58.icount = local_58.icount + 1;
        piVar13 = local_38;
      }
      pmVar3 = local_40;
      piVar11 = piVar7 + 2;
      piVar7 = piVar7 + 4;
    } while (piVar11 < piVar13);
    iVar2 = *(int *)&local_40[0x1b].field_0x60;
    if (iVar2 == 0) goto LAB_002405da;
    if (lVar6 == 0) {
      lVar6 = 0;
    }
    else {
      lVar10 = (long)local_58.size;
      if (local_58.size <= local_58.icount) {
        local_58.size = local_58.size * 2;
        local_58.items = (nh_menuitem *)realloc(local_58.items,lVar10 * 0x218);
      }
      lVar10 = (long)local_58.icount;
      local_58.items[lVar10].accel = '\0';
      local_58.items[lVar10].group_accel = '\0';
      local_58.items[lVar10].selected = '\0';
      local_58.items[lVar10].caption[0] = '\0';
      local_58.items[lVar10].id = 0;
      local_58.items[lVar10].role = MI_TEXT;
      local_58.icount = local_58.icount + 1;
      iVar2 = *(int *)&pmVar3[0x1b].field_0x60;
    }
  }
  pcVar5 = xprname((obj *)0x0,"usage charges and/or other fees",'$','\0',(long)iVar2,0);
  lVar10 = (long)local_58.size;
  if (local_58.size <= local_58.icount) {
    local_58.size = local_58.size * 2;
    local_58.items = (nh_menuitem *)realloc(local_58.items,lVar10 * 0x218);
  }
  lVar6 = lVar6 + iVar2;
  pnVar1 = local_58.items + local_58.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,pcVar5);
  local_58.icount = local_58.icount + 1;
LAB_002405da:
  pcVar5 = xprname((obj *)0x0,"Total:",'*','\0',lVar6,0);
  lVar6 = (long)local_58.size;
  if (local_58.size <= local_58.icount) {
    local_58.size = local_58.size * 2;
    local_58.items = (nh_menuitem *)realloc(local_58.items,lVar6 * 0x218);
  }
  lVar6 = (long)local_58.icount;
  local_58.items[lVar6].accel = '\0';
  local_58.items[lVar6].group_accel = '\0';
  local_58.items[lVar6].selected = '\0';
  local_58.items[lVar6].caption[0] = '\0';
  local_58.items[lVar6].id = 0;
  local_58.items[lVar6].role = MI_TEXT;
  local_58.icount = local_58.icount + 1;
  lVar6 = (long)local_58.size;
  if (local_58.size <= local_58.icount) {
    local_58.size = local_58.size * 2;
    local_58.items = (nh_menuitem *)realloc(local_58.items,lVar6 * 0x218);
  }
  pnVar1 = local_58.items + local_58.icount;
  pnVar1->id = 0;
  pnVar1->role = MI_TEXT;
  pnVar1->accel = '\0';
  pnVar1->group_accel = '\0';
  pnVar1->selected = '\0';
  strcpy(pnVar1->caption,pcVar5);
  local_58.icount = local_58.icount + 1;
  display_menu(local_58.items,local_58.icount,(char *)0x0,0,(int *)0x0);
LAB_002406d1:
  free(local_58.items);
  return 0;
}

Assistant:

int doinvbill(int mode)
{
	struct monst *shkp;
	struct eshk *eshkp;
	struct bill_x *bp, *end_bp;
	struct obj *obj;
	long totused;
	char *buf_p;
	struct menulist menu;

	shkp = shop_keeper(level, *u.ushops);
	if (!shkp || !inhishop(shkp)) {
	    if (mode != 0) warning("doinvbill: no shopkeeper?");
	    return 0;
	}
	eshkp = ESHK(shkp);

	if (mode == 0) {
	    /* count expended items, so that the `I' command can decide
	       whether to include 'x' in its prompt string */
	    int cnt = !eshkp->debit ? 0 : 1;

	    for (bp = eshkp->bill_p, end_bp = &eshkp->bill_p[eshkp->billct];
		    bp < end_bp; bp++)
		if (bp->useup ||
			((obj = bp_to_obj(bp)) != 0 && obj->quan < bp->bquan))
		    cnt++;
	    return cnt;
	}

	init_menulist(&menu);
	add_menutext(&menu, "Unpaid articles already used up:");
	add_menutext(&menu, "");

	totused = 0L;
	for (bp = eshkp->bill_p, end_bp = &eshkp->bill_p[eshkp->billct];
		bp < end_bp; bp++) {
	    obj = bp_to_obj(bp);
	    if (!obj) {
		warning("Bad shopkeeper administration.");
		goto quit;
	    }
	    if (bp->useup || bp->bquan > obj->quan) {
		long oquan, uquan, thisused;
		unsigned save_unpaid;

		save_unpaid = obj->unpaid;
		oquan = obj->quan;
		uquan = (bp->useup ? bp->bquan : bp->bquan - oquan);
		thisused = bp->price * uquan;
		totused += thisused;
		obj->unpaid = 0;		/* ditto */
		/* Why 'x'?  To match `I x', more or less. */
		buf_p = xprname(obj, NULL, 'x', FALSE, thisused, uquan);
		obj->unpaid = save_unpaid;
		add_menutext(&menu, buf_p);
	    }
	}
	if (eshkp->debit) {
	    /* additional shop debt which has no itemization available */
	    if (totused) add_menutext(&menu, "");
	    totused += eshkp->debit;
	    buf_p = xprname(NULL,
			    "usage charges and/or other fees",
			    GOLD_SYM, FALSE, eshkp->debit, 0L);
	    add_menutext(&menu, buf_p);
	}
	buf_p = xprname(NULL, "Total:", '*', FALSE, totused, 0L);
	add_menutext(&menu, "");
	add_menutext(&menu, buf_p);
	
	display_menu(menu.items, menu.icount, NULL, PICK_NONE, NULL);
    quit:
	free(menu.items);
	return 0;
}